

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O3

void __thiscall Model::Model(Model *this,double cell_volume)

{
  vector<double,_std::allocator<double>_> *pvVar1;
  _Rb_tree_header *p_Var2;
  pointer pdVar3;
  SpeciesTracker *this_00;
  vector<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_> local_60;
  vector<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_> local_48;
  
  (this->gillespie_).time_ = 0.0;
  (this->gillespie_).iteration_ = 0;
  (this->super_enable_shared_from_this<Model>)._M_weak_this.
  super___weak_ptr<Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<Model>)._M_weak_this.
  super___weak_ptr<Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->gillespie_).initialized_ = false;
  (this->gillespie_).alpha_list_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->gillespie_).alpha_list_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->gillespie_).alpha_list_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->gillespie_).alpha_sum_ = 0.0;
  (this->gillespie_).reactions_.
  super__Vector_base<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->gillespie_).reactions_.
  super__Vector_base<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->gillespie_).reactions_.
  super__Vector_base<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->genomes_).
  super__Vector_base<std::shared_ptr<Genome>,_std::allocator<std::shared_ptr<Genome>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->genomes_).
  super__Vector_base<std::shared_ptr<Genome>,_std::allocator<std::shared_ptr<Genome>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->genomes_).
  super__Vector_base<std::shared_ptr<Genome>,_std::allocator<std::shared_ptr<Genome>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->transcripts_).
  super__Vector_base<std::shared_ptr<Transcript>,_std::allocator<std::shared_ptr<Transcript>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->transcripts_).
  super__Vector_base<std::shared_ptr<Transcript>,_std::allocator<std::shared_ptr<Transcript>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->transcripts_).
  super__Vector_base<std::shared_ptr<Transcript>,_std::allocator<std::shared_ptr<Transcript>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->polymerases_).super__Vector_base<Polymerase,_std::allocator<Polymerase>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->polymerases_).super__Vector_base<Polymerase,_std::allocator<Polymerase>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->polymerases_).super__Vector_base<Polymerase,_std::allocator<Polymerase>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->cell_volume_ = cell_volume;
  this->initialized_ = false;
  p_Var2 = &(this->terminations_)._M_t._M_impl.super__Rb_tree_header;
  (this->terminations_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->terminations_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->terminations_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->terminations_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->terminations_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this_00 = SpeciesTracker::Instance();
  SpeciesTracker::Clear(this_00);
  pvVar1 = &(this->gillespie_).alpha_list_;
  *(undefined8 *)&this->gillespie_ = 0;
  (this->gillespie_).time_ = 0.0;
  (this->gillespie_).iteration_ = 0;
  pdVar3 = (pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  (this->gillespie_).alpha_list_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->gillespie_).alpha_list_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (pdVar3 != (pointer)0x0) {
    operator_delete(pdVar3);
  }
  (this->gillespie_).alpha_sum_ = 0.0;
  local_48.
  super__Vector_base<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage =
       (this->gillespie_).reactions_.
       super__Vector_base<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_48.
  super__Vector_base<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>._M_impl
  .super__Vector_impl_data._M_start =
       (this->gillespie_).reactions_.
       super__Vector_base<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_48.
  super__Vector_base<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>._M_impl
  .super__Vector_impl_data._M_finish =
       (this->gillespie_).reactions_.
       super__Vector_base<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (this->gillespie_).reactions_.
  super__Vector_base<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->gillespie_).reactions_.
  super__Vector_base<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->gillespie_).reactions_.
  super__Vector_base<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_60.
  super__Vector_base<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_60.
  super__Vector_base<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_60.
  super__Vector_base<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>::~vector
            (&local_48);
  std::vector<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>::~vector
            (&local_60);
  Signal<std::shared_ptr<Reaction>_>::ConnectMember<Gillespie>
            (&this_00->propensity_signal_,&this->gillespie_,0x12a7c4);
  return;
}

Assistant:

Model::Model(double cell_volume) : cell_volume_(cell_volume) {
  auto &tracker = SpeciesTracker::Instance();
  tracker.Clear();
  gillespie_ = Gillespie();
  tracker.propensity_signal_.ConnectMember(&gillespie_,
                                           &Gillespie::UpdatePropensity);
}